

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_views.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DefaultViewGenerator::CreateDefaultEntry
          (DefaultViewGenerator *this,ClientContext *context,string *entry_name)

{
  char *__lhs;
  Catalog *args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *args_1;
  bool bVar1;
  pointer pCVar2;
  type args_2;
  string *in_RCX;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> this_00;
  pointer *__ptr;
  long lVar3;
  _Head_base<0UL,_duckdb::CreateViewInfo_*,_false> local_98;
  undefined1 local_90 [8];
  _Head_base<0UL,_duckdb::CreateViewInfo_*,_false> local_88;
  _Alloc_hider local_80;
  ClientContext *local_78;
  string name;
  string schema;
  
  local_80._M_p = (pointer)this;
  local_78 = (ClientContext *)entry_name;
  StringUtil::Lower(&schema,(string *)
                            ((context->db).internal.
                             super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 2));
  StringUtil::Lower(&name,in_RCX);
  lVar3 = 0x10;
  do {
    if (lVar3 == 0x460) {
      local_90 = (undefined1  [8])0x0;
      this_00._M_head_impl = (CatalogEntry *)local_80._M_p;
LAB_008b6f65:
      ::std::__cxx11::string::~string((string *)&name);
      ::std::__cxx11::string::~string((string *)&schema);
      if ((_Tuple_impl<0UL,_duckdb::CreateViewInfo_*,_std::default_delete<duckdb::CreateViewInfo>_>)
          local_90 == (CreateViewInfo *)0x0) {
        (this_00._M_head_impl)->_vptr_CatalogEntry = (_func_int **)0x0;
      }
      else {
        args = (Catalog *)
               (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal
               .super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
        args_1 = (context->db).internal.
                 super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        args_2 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                 ::operator*((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                              *)local_90);
        make_uniq_base<duckdb::CatalogEntry,duckdb::ViewCatalogEntry,duckdb::Catalog&,duckdb::SchemaCatalogEntry&,duckdb::CreateViewInfo&>
                  ((duckdb *)this_00._M_head_impl,args,(SchemaCatalogEntry *)args_1,args_2);
        if (local_90 != (undefined1  [8])0x0) {
          (**(code **)(*(_func_int **)local_90 + 8))();
        }
      }
      return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
             (__uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
             this_00._M_head_impl;
    }
    __lhs = *(char **)(&UNK_0179ad48 + lVar3);
    bVar1 = ::std::operator==(*(char **)((long)&PTR_GetDefaultEntries_abi_cxx11__0179ad40 + lVar3),
                              &schema);
    if (bVar1) {
      bVar1 = ::std::operator==(__lhs,&name);
      if (bVar1) {
        make_uniq<duckdb::CreateViewInfo>();
        pCVar2 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                               *)&local_98);
        ::std::__cxx11::string::_M_assign((string *)&(pCVar2->super_CreateInfo).schema);
        pCVar2 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                               *)&local_98);
        ::std::__cxx11::string::_M_assign((string *)&pCVar2->view_name);
        pCVar2 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                               *)&local_98);
        ::std::__cxx11::string::assign((char *)&(pCVar2->super_CreateInfo).sql);
        pCVar2 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                               *)&local_98);
        (pCVar2->super_CreateInfo).temporary = true;
        pCVar2 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                               *)&local_98);
        (pCVar2->super_CreateInfo).internal = true;
        local_88._M_head_impl = local_98._M_head_impl;
        local_98._M_head_impl = (CreateViewInfo *)0x0;
        CreateViewInfo::FromSelect
                  ((CreateViewInfo *)local_90,local_78,
                   (unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                    *)&local_88);
        this_00._M_head_impl = (CatalogEntry *)local_80._M_p;
        if (local_88._M_head_impl != (CreateViewInfo *)0x0) {
          (*((local_88._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
        }
        local_88._M_head_impl = (CreateViewInfo *)0x0;
        if (local_98._M_head_impl != (CreateViewInfo *)0x0) {
          (*((local_98._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
        }
        goto LAB_008b6f65;
      }
    }
    lVar3 = lVar3 + 0x18;
  } while( true );
}

Assistant:

unique_ptr<CatalogEntry> DefaultViewGenerator::CreateDefaultEntry(ClientContext &context, const string &entry_name) {
	auto info = GetDefaultView(context, schema.name, entry_name);
	if (info) {
		return make_uniq_base<CatalogEntry, ViewCatalogEntry>(catalog, schema, *info);
	}
	return nullptr;
}